

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::CmpHelperNeIterator<unsigned_long_const*,unsigned_long_const*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,unsigned_long *b1,unsigned_long *e1,
          unsigned_long *b2,unsigned_long *e2)

{
  bool bVar1;
  AssertionResult *rhs;
  unsigned_long *puVar2;
  AssertionResult local_268;
  string local_240;
  AssertionResult local_210;
  AssertionResult local_1e8;
  undefined1 local_1c0 [8];
  Message ar;
  bool result;
  int elem;
  unsigned_long *e2_local;
  unsigned_long *b2_local;
  unsigned_long *e1_local;
  unsigned_long *b1_local;
  
  ar.m_stream.super_iu_stringstream._388_4_ = 0;
  ar.m_stream.super_iu_stringstream._387_1_ = 0;
  iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_1c0);
  ar.m_stream.super_iu_stringstream._388_4_ = 0;
  e2_local = e1;
  for (e1_local = (unsigned_long *)this; e1_local != b1 && e2_local != b2; e1_local = e1_local + 1)
  {
    puVar2 = e1_local;
    iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
              (&local_210,"","",e1_local,e2_local);
    iutest::AssertionResult::operator!(&local_1e8,&local_210);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool(&local_1e8);
    iutest::AssertionResult::~AssertionResult(&local_1e8);
    iutest::AssertionResult::~AssertionResult(&local_210);
    if (bVar1) {
      iutest::internal::FormatForComparisonFailureMessage<unsigned_long,unsigned_long>
                (&local_240,(internal *)e1_local,e2_local,puVar2);
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1c0,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
    }
    else {
      ar.m_stream.super_iu_stringstream._387_1_ = 1;
    }
    e2_local = e2_local + 1;
    ar.m_stream.super_iu_stringstream._388_4_ = ar.m_stream.super_iu_stringstream._388_4_ + 1;
  }
  if ((e1_local != b1) || (e2_local != b2)) {
    ar.m_stream.super_iu_stringstream._387_1_ = 1;
  }
  if ((ar.m_stream.super_iu_stringstream._387_1_ & 1) == 0) {
    iutest::AssertionFailure();
    rhs = iutest::AssertionResult::operator<<(&local_268,(iuStreamMessage *)local_1c0);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    iutest::AssertionResult::~AssertionResult(&local_268);
  }
  else {
    iutest::AssertionSuccess();
  }
  iutest::detail::iuStreamMessage::~iuStreamMessage((iuStreamMessage *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = false;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::NeHelper<false>::Compare("", "", *b1, *b2))
        {
            ar << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2);
        }
        else
        {
            result = true;
        }
    }
    if( (b1 != e1) || (b2 != e2) )
    {
        result = true;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}